

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong size;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int NWL;
  int NWS;
  int NWM;
  int local_e4;
  int local_e0;
  int local_dc;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_cold_8();
  }
  else if (s2Len < 1) {
    parasail_nw_stats_cold_7();
  }
  else if (open < 0) {
    parasail_nw_stats_cold_6();
  }
  else if (gap < 0) {
    parasail_nw_stats_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_cold_4();
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_nw_stats_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_nw_stats_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    ppVar7 = parasail_result_new_stats();
    if (ppVar7 != (parasail_result_t *)0x0) {
      ppVar7->flag = ppVar7->flag | 0x1410101;
      ptr = parasail_memalign_int(0x10,(long)_s1Len);
      size = (ulong)(uint)s2Len;
      ptr_00 = parasail_memalign_int(0x10,size);
      uVar13 = (ulong)(s2Len + 1);
      ptr_01 = parasail_memalign_int(0x10,uVar13);
      ptr_02 = parasail_memalign_int(0x10,uVar13);
      ptr_03 = parasail_memalign_int(0x10,uVar13);
      ptr_04 = parasail_memalign_int(0x10,uVar13);
      ptr_05 = parasail_memalign_int(0x10,uVar13);
      ptr_06 = parasail_memalign_int(0x10,uVar13);
      ptr_07 = parasail_memalign_int(0x10,uVar13);
      ptr_08 = parasail_memalign_int(0x10,uVar13);
      if ((ptr_08 != (int *)0x0 && (ptr_07 != (int *)0x0 && ptr_06 != (int *)0x0)) &&
          ((ptr_05 != (int *)0x0 && (ptr_04 != (int *)0x0 && ptr_03 != (int *)0x0)) &&
          ((ptr_02 != (int *)0x0 && ptr_01 != (int *)0x0) &&
          (ptr_00 != (int *)0x0 && ptr != (int *)0x0)))) {
        if (0 < _s1Len) {
          piVar5 = matrix->mapper;
          uVar13 = 0;
          do {
            ptr[uVar13] = piVar5[(byte)_s1[uVar13]];
            uVar13 = uVar13 + 1;
          } while ((uint)_s1Len != uVar13);
        }
        piVar5 = matrix->mapper;
        uVar13 = 1;
        if (1 < s2Len) {
          uVar13 = (ulong)(uint)s2Len;
        }
        uVar11 = 0;
        do {
          ptr_00[uVar11] = piVar5[(byte)_s2[uVar11]];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        *ptr_01 = 0;
        *ptr_02 = 0;
        *ptr_03 = 0;
        *ptr_04 = 0;
        *ptr_05 = -0x40000000;
        *ptr_06 = 0;
        *ptr_07 = 0;
        *ptr_08 = 0;
        iVar8 = -open;
        lVar14 = 0;
        do {
          *(int *)((long)ptr_01 + lVar14 + 4) = iVar8;
          *(undefined4 *)((long)ptr_02 + lVar14 + 4) = 0;
          *(undefined4 *)((long)ptr_03 + lVar14 + 4) = 0;
          *(undefined4 *)((long)ptr_04 + lVar14 + 4) = 0;
          *(undefined4 *)((long)ptr_05 + lVar14 + 4) = 0xc0000000;
          *(undefined4 *)((long)ptr_06 + lVar14 + 4) = 0;
          *(undefined4 *)((long)ptr_07 + lVar14 + 4) = 0;
          *(undefined4 *)((long)ptr_08 + lVar14 + 4) = 0;
          iVar8 = iVar8 - gap;
          lVar14 = lVar14 + 4;
        } while (uVar13 << 2 != lVar14);
        if (0 < _s1Len) {
          uVar11 = 1;
          do {
            if (matrix->type == 0) {
              iVar8 = matrix->size;
              lVar14 = (long)ptr[uVar11 - 1];
            }
            else {
              iVar8 = matrix->size;
              lVar14 = uVar11 - 1;
            }
            piVar5 = matrix->matrix;
            iVar21 = *ptr_01;
            iVar23 = *ptr_02;
            iVar25 = *ptr_03;
            iVar6 = *ptr_04;
            iVar12 = -(((int)uVar11 + -1) * gap + open);
            *ptr_01 = iVar12;
            lVar20 = 0;
            *ptr_02 = 0;
            *ptr_03 = 0;
            *ptr_04 = 0;
            iVar16 = -0x40000000;
            local_dc = 0;
            local_e0 = 0;
            local_e4 = 0;
            iVar22 = 0;
            iVar24 = 0;
            iVar15 = 0;
            do {
              iVar1 = *(int *)((long)ptr_01 + lVar20 + 4);
              iVar2 = *(int *)((long)ptr_02 + lVar20 + 4);
              iVar3 = *(int *)((long)ptr_03 + lVar20 + 4);
              iVar17 = iVar1 - open;
              iVar9 = *(int *)((long)ptr_05 + lVar20 + 4) - gap;
              iVar10 = iVar9;
              if (iVar9 < iVar17) {
                iVar10 = iVar17;
              }
              iVar4 = *(int *)((long)ptr_04 + lVar20 + 4);
              *(int *)((long)ptr_05 + lVar20 + 4) = iVar10;
              iVar18 = iVar12 - open;
              iVar19 = iVar16 - gap;
              iVar16 = iVar18;
              if (iVar18 <= iVar19) {
                iVar16 = iVar19;
              }
              iVar21 = iVar21 + piVar5[lVar14 * iVar8 + (long)*(int *)((long)ptr_00 + lVar20)];
              iVar12 = iVar16;
              if (iVar16 < iVar21) {
                iVar12 = iVar21;
              }
              if (iVar12 <= iVar10) {
                iVar12 = iVar10;
              }
              if (iVar9 < iVar17) {
                *(int *)((long)ptr_06 + lVar20 + 4) = iVar2;
                *(int *)((long)ptr_07 + lVar20 + 4) = iVar3;
                *(int *)((long)ptr_08 + lVar20 + 4) = iVar4;
              }
              iVar17 = *(int *)((long)ptr_08 + lVar20 + 4) + 1;
              *(int *)((long)ptr_08 + lVar20 + 4) = iVar17;
              iVar10 = iVar24;
              iVar9 = iVar15;
              if (iVar18 <= iVar19) {
                iVar10 = local_e0;
                iVar22 = local_dc;
                iVar9 = local_e4;
              }
              local_dc = iVar22 + 1;
              if (iVar12 == iVar21) {
                iVar22 = iVar6 + 1;
                iVar15 = iVar23 + (uint)(ptr[uVar11 - 1] == *(int *)((long)ptr_00 + lVar20));
                iVar24 = iVar25 + (uint)(0 < piVar5[lVar14 * iVar8 +
                                                    (long)*(int *)((long)ptr_00 + lVar20)]);
              }
              else {
                iVar22 = local_dc;
                iVar15 = iVar9;
                iVar24 = iVar10;
                if (iVar12 == *(int *)((long)ptr_05 + lVar20 + 4)) {
                  iVar15 = *(int *)((long)ptr_06 + lVar20 + 4);
                  iVar24 = *(int *)((long)ptr_07 + lVar20 + 4);
                  iVar22 = iVar17;
                }
              }
              *(int *)((long)ptr_01 + lVar20 + 4) = iVar12;
              *(int *)((long)ptr_02 + lVar20 + 4) = iVar15;
              *(int *)((long)ptr_03 + lVar20 + 4) = iVar24;
              *(int *)((long)ptr_04 + lVar20 + 4) = iVar22;
              lVar20 = lVar20 + 4;
              iVar21 = iVar1;
              iVar23 = iVar2;
              iVar25 = iVar3;
              iVar6 = iVar4;
              local_e4 = iVar9;
              local_e0 = iVar10;
            } while (uVar13 << 2 != lVar20);
            uVar11 = uVar11 + 1;
          } while (uVar11 != _s1Len + 1);
        }
        ppVar7->score = ptr_01[size];
        ppVar7->end_query = _s1Len - 1;
        ppVar7->end_ref = s2Len + -1;
        ((ppVar7->field_4).stats)->matches = ptr_02[size];
        ((ppVar7->field_4).stats)->similar = ptr_03[size];
        ((ppVar7->field_4).stats)->length = ptr_04[size];
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        return ppVar7;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open - (j-1)*gap;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = -open - (i-1)*gap;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int H_new;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            H_new = MAX(H_dag, E);
            H_new = MAX(H_new, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            WH = H_new;
            if (H_new == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (H_new == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;
    result->stats->matches = HM[s2Len];
    result->stats->similar = HS[s2Len];
    result->stats->length = HL[s2Len];

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}